

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_36_c.c
# Opt level: O1

void encode_pure(char *digits,uint digits_size,uint width,int value,char *result)

{
  uint uVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  char buf [16];
  undefined8 uStack_30;
  char local_28 [16];
  
  uVar4 = (ulong)(uint)-value;
  if (0 < value) {
    uVar4 = (ulong)(uint)value;
  }
  uVar1 = 1;
  do {
    uVar5 = uVar1;
    uVar3 = (uint)uVar4;
    local_28[uVar5 - 1] = digits[uVar4 % (ulong)digits_size];
    uVar4 = uVar4 / digits_size;
    uVar1 = uVar5 + 1;
  } while (digits_size <= uVar3);
  if (value < 0) {
    local_28[uVar5] = '-';
    uVar5 = uVar5 + 1;
  }
  if (uVar5 < width) {
    uStack_30 = 0x123865;
    memset(result,0x20,(ulong)(~uVar5 + width) + 1);
    result = result + (ulong)(~uVar5 + width) + 1;
  }
  if (uVar5 != 0) {
    uVar4 = (ulong)uVar5;
    pcVar2 = result;
    do {
      result = pcVar2 + 1;
      *pcVar2 = local_28[uVar4 - 1];
      uVar4 = uVar4 - 1;
      pcVar2 = result;
    } while (uVar4 != 0);
  }
  *result = '\0';
  return;
}

Assistant:

static
void
encode_pure(
  const char* digits,
  unsigned digits_size,
  unsigned width,
  int value,
  char* result)
{
  char buf[16];
  int rest;
  unsigned i, j;
  i = 0;
  j = 0;
  if (value < 0) {
    j = 1;
    value = -value;
  }
  while (1) {
    rest = value / digits_size;
    buf[i++] = digits[value - rest * digits_size];
    if (rest == 0) break;
    value = rest;
  }
  if (j) buf[i++] = '-';
  for(j=i;j<width;j++) *result++ = ' ';
  while (i != 0) *result++ = buf[--i];
  *result = '\0';
}